

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# axl_sl_String.h
# Opt level: O1

int __thiscall
axl::sl::StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::copy
          (StringBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_> *this,EVP_PKEY_CTX *dst,
          EVP_PKEY_CTX *src)

{
  BufHdr *pBVar1;
  C *pCVar2;
  size_t sVar3;
  UtfDfa<axl::enc::Utf8Dfa,_axl::enc::Utf8CcMap> local_38;
  CountingEmitter local_30;
  
  if (src == (EVP_PKEY_CTX *)0xffffffffffffffff) {
    if (dst == (EVP_PKEY_CTX *)0x0) {
      src = (EVP_PKEY_CTX *)0x0;
    }
    else {
      src = (EVP_PKEY_CTX *)strlen((char *)dst);
    }
  }
  if (src == (EVP_PKEY_CTX *)0x0) {
    pBVar1 = (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_hdr;
    if (pBVar1 != (BufHdr *)0x0) {
      if ((pBVar1->super_RefCount).m_refCount == 1) {
        (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p =
             (C *)(pBVar1 + 1);
        *(undefined4 *)&pBVar1[1].super_RefCount._vptr_RefCount = 0;
        (this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_length = 0;
      }
      else {
        StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>::release
                  (&this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>);
      }
    }
    sVar3 = 0;
  }
  else {
    local_30.m_length = 0;
    local_30.m_replacement = 0xfffd;
    local_38.m_state = 0;
    local_38.m_cp = 0;
    enc::Utf8Decoder::
    decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::CountingEmitter>
              ((Dfa *)&local_38,&local_30,(C *)dst,(C *)(src + (long)dst));
    sVar3 = local_30.m_length;
    pCVar2 = createBuffer(this,local_30.m_length,false);
    if (pCVar2 == (C *)0x0) {
      sVar3 = 0xffffffffffffffff;
    }
    else {
      local_30.m_length =
           (size_t)(this->super_StringRefBase<wchar_t,_axl::sl::StringDetailsBase<wchar_t>_>).m_p;
      local_30.m_replacement = 0xfffd;
      local_38.m_state = 0;
      local_38.m_cp = 0;
      enc::Utf8Decoder::
      decodeImpl<axl::enc::Convert<axl::enc::Utf32,axl::enc::Utf8,axl::sl::Nop<wchar_t,wchar_t>,axl::enc::Utf8Decoder>::EncodingEmitter_u>
                ((Dfa *)&local_38,(EncodingEmitter_u *)&local_30,(C *)dst,(C *)(src + (long)dst));
    }
  }
  return (int)sVar3;
}

Assistant:

size_t
	copy(
		const C2* p,
		size_t length = -1
	) {
		if (length == -1)
			length = Details2::calcLength(p);

		if (!length) {
			clear();
			return 0;
		}

		// TODO: remove pre-calculation of required length

		size_t newLength = enc::Convert<Encoding, Encoding2>::calcRequiredLength(p, p + length);
		if (!createBuffer(newLength, false))
			return -1;

		enc::Convert<Encoding, Encoding2>::convert_u(this->m_p, p, p + length);
		return newLength;
	}